

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

string * tinygltf::GetBaseDir(string *__return_storage_ptr__,string *filepath)

{
  long lVar1;
  string *psVar2;
  string *extraout_RAX;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filepath,0x1622f3,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::find_last_of((char *)filepath,0x1622f3,0xffffffffffffffff);
    psVar2 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
    return psVar2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return extraout_RAX;
}

Assistant:

static std::string GetBaseDir(const std::string &filepath) {
  if (filepath.find_last_of("/\\") != std::string::npos)
    return filepath.substr(0, filepath.find_last_of("/\\") + 1);
  return "";
}